

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

void poly_marshal_mod3(uint8_t *out,poly *in)

{
  size_t i;
  long lVar1;
  uint uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  
  if ((in->field_0).v[700] == 0) {
    for (lVar1 = 0; lVar1 != 0x8c; lVar1 = lVar1 + 1) {
      uVar2 = (in->field_0).v[0] & 3;
      uVar3 = (in->field_0).v[1] & 3;
      uVar4 = (in->field_0).v[2] & 3;
      uVar5 = (in->field_0).v[3] & 3;
      uVar6 = (in->field_0).v[4] & 3;
      out[lVar1] = ((byte)(uVar6 >> 1) ^ (byte)uVar6) * 'Q' +
                   ((byte)(uVar4 >> 1) ^ (byte)uVar4) * '\t' +
                   ((byte)(uVar5 >> 1) ^ (byte)uVar5) * '\x1b' +
                   ((byte)(uVar3 >> 1) ^ (byte)uVar3) * '\x03' + ((byte)(uVar2 >> 1) ^ (byte)uVar2);
      in = (poly *)((long)&in->field_0 + 10);
    }
    return;
  }
  __assert_fail("coeffs[N - 1] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                ,0x681,"void poly_marshal_mod3(uint8_t *, const struct poly *)");
}

Assistant:

static void poly_marshal_mod3(uint8_t out[HRSS_POLY3_BYTES],
                              const struct poly *in) {
  const uint16_t *coeffs = in->v;

  // Only 700 coefficients are marshaled because in[700] must be zero.
  assert(coeffs[N - 1] == 0);

  for (size_t i = 0; i < HRSS_POLY3_BYTES; i++) {
    const uint16_t coeffs0 = mod3_from_modQ(coeffs[0]);
    const uint16_t coeffs1 = mod3_from_modQ(coeffs[1]);
    const uint16_t coeffs2 = mod3_from_modQ(coeffs[2]);
    const uint16_t coeffs3 = mod3_from_modQ(coeffs[3]);
    const uint16_t coeffs4 = mod3_from_modQ(coeffs[4]);
    out[i] = coeffs0 + coeffs1 * 3 + coeffs2 * 9 + coeffs3 * 27 + coeffs4 * 81;
    coeffs += 5;
  }
}